

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::IOEffect::Encode(IOEffect *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  IOEffect *this_local;
  
  StandardVariable::Encode(&this->super_StandardVariable,stream);
  pKVar1 = KDataStream::operator<<(stream,(this->super_StandardVariable).field_0xe);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->super_StandardVariable).field_0xf);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Eff);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8EffDtyCyc);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16EffDur);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Proc);
  KDataStream::operator<<(pKVar1,this->m_ui16Padding);
  return;
}

Assistant:

void IOEffect::Encode( KDataStream & stream ) const
{
    StandardVariable::Encode( stream );

    stream << m_ui8Status
           << m_ui8LnkTyp
           << m_ui8Eff
           << m_ui8EffDtyCyc
           << m_ui16EffDur
           << m_ui16Proc
           << m_ui16Padding;
}